

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImVec2 *pIVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined4 uVar4;
  ImGuiWindow *pIVar5;
  ImGuiTable *pIVar6;
  ImGuiTableTempData *pIVar7;
  ImGuiTableInstanceData *pIVar8;
  ImGuiWindow *pIVar9;
  float *__src;
  ImGuiTableColumn *pIVar10;
  char *__src_00;
  void *ptr;
  ImGuiContext *pIVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  ImU32 IVar15;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar16;
  ImGuiTableInstanceData *__dest;
  ImRect *pIVar17;
  float *__dest_00;
  char *__dest_01;
  int iVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  undefined4 *puVar22;
  undefined8 *puVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  ImGuiContext *g;
  size_t size;
  ImGuiTableColumn *pIVar30;
  byte bVar31;
  uint uVar32;
  ImVec2 IVar33;
  float fVar34;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  ImRect outer_rect;
  void *local_e8;
  ImRect local_c8;
  ImGuiTableTempData *local_b8;
  char *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar11 = GImGui;
  bVar31 = 0;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar5 = pIVar11->CurrentWindow;
  if (pIVar5->SkipItems == false) {
    IVar33 = GetContentRegionAvail();
    fVar38 = IVar33.y;
    auVar37._8_4_ = (int)extraout_XMM0_Qb;
    auVar37._0_4_ = IVar33.x;
    auVar37._4_4_ = IVar33.y;
    auVar37._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    if (IVar33.x <= 1.0) {
      auVar37._0_4_ = 0x3f800000;
    }
    if ((flags & 0x3000000U) == 0) {
      IVar33 = CalcItemSize(*outer_size,auVar37._0_4_,0.0);
      local_c8.Min = (pIVar5->DC).CursorPos;
      local_c8.Max.x = IVar33.x + local_c8.Min.x;
      local_c8.Max.y = IVar33.y + local_c8.Min.y;
    }
    else {
      if (fVar38 <= 1.0) {
        fVar38 = 1.0;
      }
      IVar33 = CalcItemSize(*outer_size,auVar37._0_4_,fVar38);
      local_c8.Min = (pIVar5->DC).CursorPos;
      local_c8.Max.x = IVar33.x + local_c8.Min.x;
      local_c8.Max.y = IVar33.y + local_c8.Min.y;
      bVar12 = IsClippedEx(&local_c8,0);
      if (bVar12) {
        local_a8.x = local_c8.Max.x - local_c8.Min.x;
        local_a8.y = local_c8.Max.y - local_c8.Min.y;
        ItemSize(&local_a8,-1.0);
        goto LAB_00231c06;
      }
    }
    local_b0 = name;
    table = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar11->Tables,id);
    iVar18 = 0;
    if (table->LastFrameActive == pIVar11->FrameCount) {
      iVar18 = table->InstanceCurrent + 1;
    }
    uVar19 = table->Flags;
    pIVar6 = (pIVar11->Tables).Buf.Data;
    iVar24 = pIVar11->TablesTempDataStacked;
    iVar21 = iVar24 + 1;
    pIVar11->TablesTempDataStacked = iVar21;
    if ((pIVar11->TablesTempData).Size <= iVar24) {
      uStack_a0 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_98._Channels.Data._3_4_ = 0;
      local_98._Channels.Data._7_1_ = 0;
      uStack_80 = 0;
      local_98._Current = 0;
      local_98._Count = 0;
      local_98._Channels._0_7_ = 0;
      local_98._Channels._7_4_ = 0;
      local_a8.x = 0.0;
      local_a8.y = -1.0;
      iVar26 = (pIVar11->TablesTempData).Capacity;
      if (iVar26 <= iVar24) {
        if (iVar26 == 0) {
          iVar29 = 8;
        }
        else {
          iVar29 = iVar26 / 2 + iVar26;
        }
        if (iVar29 <= iVar21) {
          iVar29 = iVar21;
        }
        if (iVar26 < iVar29) {
          pIVar16 = (ImGuiTableTempData *)MemAlloc((long)iVar29 * 0x70);
          pIVar7 = (pIVar11->TablesTempData).Data;
          if (pIVar7 != (ImGuiTableTempData *)0x0) {
            local_b8 = pIVar16;
            memcpy(pIVar16,pIVar7,(long)(pIVar11->TablesTempData).Size * 0x70);
            MemFree((pIVar11->TablesTempData).Data);
            pIVar16 = local_b8;
          }
          (pIVar11->TablesTempData).Data = pIVar16;
          (pIVar11->TablesTempData).Capacity = iVar29;
        }
      }
      iVar26 = (pIVar11->TablesTempData).Size;
      if (iVar26 <= iVar24) {
        iVar24 = (iVar24 - iVar26) + 1;
        lVar28 = (long)iVar26 * 0x70;
        do {
          memcpy((void *)((long)&((pIVar11->TablesTempData).Data)->TableIndex + lVar28),&local_a8,
                 0x70);
          lVar28 = lVar28 + 0x70;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      (pIVar11->TablesTempData).Size = iVar21;
      ImDrawListSplitter::ClearFreeMemory(&local_98);
      ptr = (void *)CONCAT17(local_98._Channels.Data._7_1_,
                             CONCAT43(local_98._Channels.Data._3_4_,local_98._Channels.Data._0_3_));
      if (ptr != (void *)0x0) {
        MemFree(ptr);
      }
    }
    iVar21 = (int)((long)table - (long)pIVar6 >> 3) * 0x7a44c6b;
    lVar28 = (long)pIVar11->TablesTempDataStacked;
    pIVar7 = (pIVar11->TablesTempData).Data;
    table->TempData = pIVar7 + lVar28 + -1;
    pIVar7[lVar28 + -1].TableIndex = iVar21;
    pIVar16 = table->TempData;
    table->DrawSplitter = &pIVar16->DrawSplitter;
    (pIVar16->DrawSplitter)._Current = 0;
    (pIVar16->DrawSplitter)._Count = 1;
    bVar12 = (flags & 0xe000U) == 0;
    table->IsDefaultSizingPolicy = bVar12;
    uVar13 = flags;
    if (bVar12) {
      uVar13 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar13 = 0x2000, (pIVar5->Flags & 0x40) == 0)) {
        uVar13 = 0x8000;
      }
      uVar13 = uVar13 | flags;
    }
    uVar14 = uVar13 | 0x40000;
    if ((uVar13 & 0xe000) != 0x4000) {
      uVar14 = uVar13;
    }
    uVar13 = uVar14 & 0xfffcffff;
    if ((uVar14 & 0x3000000) == 0) {
      uVar13 = uVar14;
    }
    uVar32 = uVar13 & 0xfffff7ff;
    if ((uVar13 >> 0xc & 1) == 0) {
      uVar32 = uVar13;
    }
    uVar13 = (uVar14 & 1) << 9 | uVar32;
    uVar14 = uVar13 | 0x10;
    if ((uVar32 & 0xf) == 0) {
      uVar13 = uVar14;
    }
    if (((uint)pIVar5->RootWindow->Flags >> 8 & 1) != 0) {
      uVar13 = uVar14;
    }
    table->ID = id;
    table->Flags = uVar13;
    table->InstanceCurrent = (ImS16)iVar18;
    table->LastFrameActive = pIVar11->FrameCount;
    table->InnerWindow = pIVar5;
    table->OuterWindow = pIVar5;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    pIVar7[lVar28 + -1].UserOuterSize = *outer_size;
    if ((0 < iVar18) && (iVar24 = (table->InstanceDataExtra).Size, iVar24 < iVar18)) {
      iVar26 = (table->InstanceDataExtra).Capacity;
      if (iVar24 == iVar26) {
        if (iVar26 == 0) {
          iVar29 = 8;
        }
        else {
          iVar29 = iVar26 / 2 + iVar26;
        }
        iVar25 = iVar24 + 1;
        if (iVar24 + 1 < iVar29) {
          iVar25 = iVar29;
        }
        if (iVar26 < iVar25) {
          __dest = (ImGuiTableInstanceData *)MemAlloc((long)iVar25 << 3);
          pIVar8 = (table->InstanceDataExtra).Data;
          if (pIVar8 != (ImGuiTableInstanceData *)0x0) {
            memcpy(__dest,pIVar8,(long)(table->InstanceDataExtra).Size << 3);
            MemFree((table->InstanceDataExtra).Data);
          }
          (table->InstanceDataExtra).Data = __dest;
          (table->InstanceDataExtra).Capacity = iVar25;
        }
      }
      pIVar8 = (table->InstanceDataExtra).Data + (table->InstanceDataExtra).Size;
      pIVar8->LastOuterHeight = 0.0;
      pIVar8->LastFirstRowHeight = 0.0;
      (table->InstanceDataExtra).Size = (table->InstanceDataExtra).Size + 1;
    }
    if ((flags & 0x3000000U) == 0) {
      pIVar17 = &local_c8;
      (table->InnerRect).Min = local_c8.Min;
      (table->InnerRect).Max = local_c8.Max;
      (table->OuterRect).Min = local_c8.Min;
      (table->OuterRect).Max = local_c8.Max;
      lVar20 = 0x110;
    }
    else {
      fVar38 = inner_width;
      if ((uVar13 & 0x1000000) == 0) {
        fVar38 = 3.4028235e+38;
      }
      fVar38 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                      (uint)fVar38 & -(uint)(0.0 < inner_width));
      if (fVar38 != 3.4028235e+38 || (uVar13 & 0x3000000) == 0x1000000) {
        if ((uVar13 & 0x3000000) == 0x1000000) {
          local_a8.y = 1.1754944e-38;
        }
        else {
          local_a8.y = 0.0;
        }
        local_a8.x = (float)(-(uint)(fVar38 != 3.4028235e+38) & (uint)fVar38);
        SetNextWindowContentSize(&local_a8);
      }
      if ((uVar19 & 0x3000000) == 0) {
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        SetNextWindowScroll(&local_a8);
      }
      local_a8.x = local_c8.Max.x - local_c8.Min.x;
      local_a8.y = local_c8.Max.y - local_c8.Min.y;
      BeginChildEx(local_b0,iVar18 + id,&local_a8,false,(uVar13 & 0x1000000) >> 0xd);
      pIVar9 = pIVar11->CurrentWindow;
      table->InnerWindow = pIVar9;
      IVar33 = (pIVar9->WorkRect).Max;
      (table->WorkRect).Min = (pIVar9->WorkRect).Min;
      (table->WorkRect).Max = IVar33;
      IVar33 = pIVar9->Pos;
      IVar35.x = (pIVar9->Size).x + IVar33.x;
      IVar35.y = (pIVar9->Size).y + IVar33.y;
      (table->OuterRect).Min = IVar33;
      (table->OuterRect).Max = IVar35;
      pIVar17 = &pIVar9->InnerRect;
      lVar20 = 0x100;
    }
    IVar33 = pIVar17->Max;
    pIVar1 = (ImVec2 *)((long)&table->ID + lVar20);
    *pIVar1 = pIVar17->Min;
    pIVar1[1] = IVar33;
    PushOverrideID(iVar18 + id);
    pIVar9 = table->InnerWindow;
    table->HostIndentX = (pIVar9->DC).Indent.x;
    IVar33 = (pIVar9->ClipRect).Max;
    (table->HostClipRect).Min = (pIVar9->ClipRect).Min;
    (table->HostClipRect).Max = IVar33;
    table->HostSkipItems = pIVar9->SkipItems;
    IVar33 = (pIVar9->WorkRect).Max;
    pIVar7[lVar28 + -1].HostBackupWorkRect.Min = (pIVar9->WorkRect).Min;
    pIVar7[lVar28 + -1].HostBackupWorkRect.Max = IVar33;
    IVar33 = (pIVar9->ParentWorkRect).Max;
    pIVar7[lVar28 + -1].HostBackupParentWorkRect.Min = (pIVar9->ParentWorkRect).Min;
    pIVar7[lVar28 + -1].HostBackupParentWorkRect.Max = IVar33;
    pIVar7[lVar28 + -1].HostBackupColumnsOffset.x = (pIVar5->DC).ColumnsOffset.x;
    pIVar7[lVar28 + -1].HostBackupPrevLineSize = (pIVar9->DC).PrevLineSize;
    pIVar7[lVar28 + -1].HostBackupCurrLineSize = (pIVar9->DC).CurrLineSize;
    pIVar7[lVar28 + -1].HostBackupCursorMaxPos = (pIVar9->DC).CursorMaxPos;
    pIVar7[lVar28 + -1].HostBackupItemWidth = (pIVar5->DC).ItemWidth;
    pIVar7[lVar28 + -1].HostBackupItemWidthStackSize = (pIVar5->DC).ItemWidthStack.Size;
    fVar38 = 0.0;
    fVar34 = 0.0;
    if ((uVar13 >> 9 & 1) != 0) {
      fVar34 = 1.0;
    }
    (pIVar9->DC).CurrLineSize.x = 0.0;
    (pIVar9->DC).CurrLineSize.y = 0.0;
    (pIVar9->DC).PrevLineSize.x = 0.0;
    (pIVar9->DC).PrevLineSize.y = 0.0;
    if ((uVar13 & 0x800200) == 0) {
      fVar38 = (pIVar11->Style).CellPadding.x;
    }
    fVar40 = 0.0;
    fVar39 = 0.0;
    if ((uVar13 & 0x800200) == 0x200) {
      fVar39 = (pIVar11->Style).CellPadding.x;
    }
    table->CellSpacingX1 = fVar34 + fVar38;
    table->CellSpacingX2 = fVar38;
    table->CellPaddingX = fVar39;
    table->CellPaddingY = (pIVar11->Style).CellPadding.y;
    fVar38 = 0.0;
    if ((uVar13 >> 10 & 1) != 0) {
      fVar38 = 1.0;
    }
    if ((uVar13 >> 0x16 & 1) == 0 && (uVar13 & 0x200400) != 0) {
      fVar40 = (pIVar11->Style).CellPadding.x;
    }
    table->OuterPaddingX = (fVar38 + fVar40) - fVar39;
    table->CurrentRow = -1;
    table->CurrentColumn = -1;
    table->RowBgColorCounter = 0;
    *(uint *)&table->field_0x98 = (uint)*(ushort *)&table->field_0x98;
    pIVar17 = &pIVar9->ClipRect;
    if (pIVar9 == pIVar5) {
      pIVar17 = &table->WorkRect;
    }
    IVar33 = pIVar17->Max;
    (table->InnerClipRect).Min = pIVar17->Min;
    (table->InnerClipRect).Max = IVar33;
    IVar33 = (table->InnerClipRect).Min;
    auVar36._8_8_ = 0;
    auVar36._0_4_ = (table->InnerClipRect).Max.x;
    auVar36._4_4_ = (table->InnerClipRect).Max.y;
    IVar35 = (table->WorkRect).Min;
    fVar39 = IVar35.x;
    fVar40 = IVar35.y;
    auVar41._8_8_ = 0;
    auVar41._0_4_ = (table->WorkRect).Max.x;
    auVar41._4_4_ = (table->WorkRect).Max.y;
    auVar37 = minps(auVar36,auVar41);
    fVar38 = IVar33.x;
    fVar34 = IVar33.y;
    uVar14 = -(uint)(fVar39 <= fVar38);
    uVar32 = -(uint)(fVar40 <= fVar34);
    (table->InnerClipRect).Min =
         (ImVec2)(CONCAT44(~uVar32 & (uint)fVar40,~uVar14 & (uint)fVar39) |
                 CONCAT44((uint)fVar34 & uVar32,(uint)fVar38 & uVar14));
    (table->InnerClipRect).Max = auVar37._0_8_;
    ImRect::ClipWithFull(&table->InnerClipRect,&table->HostClipRect);
    if ((uVar13 >> 0x11 & 1) == 0) {
      fVar38 = (pIVar9->ClipRect).Max.y;
    }
    else {
      fVar38 = (table->InnerClipRect).Max.y;
      fVar34 = (pIVar9->WorkRect).Max.y;
      if (fVar34 <= fVar38) {
        fVar38 = fVar34;
      }
    }
    (table->InnerClipRect).Max.y = fVar38;
    fVar38 = (table->WorkRect).Min.y;
    table->RowPosY2 = fVar38;
    table->RowPosY1 = fVar38;
    table->RowTextBaseline = 0.0;
    table->FreezeRowsRequest = '\0';
    table->FreezeRowsCount = '\0';
    table->FreezeColumnsRequest = '\0';
    table->FreezeColumnsCount = '\0';
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = '\0';
    IVar15 = GetColorU32(0x2b,1.0);
    table->BorderColorStrong = IVar15;
    IVar15 = GetColorU32(0x2c,1.0);
    table->BorderColorLight = IVar15;
    pIVar11->CurrentTable = table;
    (pIVar5->DC).CurrentTableIdx = iVar21;
    if (pIVar9 != pIVar5) {
      (pIVar9->DC).CurrentTableIdx = iVar21;
    }
    if (((uVar19 & 2) != 0) && ((uVar13 & 2) == 0)) {
      table->IsResetDisplayOrderRequest = true;
    }
    if ((pIVar11->TablesLastTimeActive).Size <= iVar21) {
      iVar24 = iVar21 + 1;
      iVar18 = (pIVar11->TablesLastTimeActive).Capacity;
      if (iVar18 <= iVar21) {
        if (iVar18 == 0) {
          iVar26 = 8;
        }
        else {
          iVar26 = iVar18 / 2 + iVar18;
        }
        if (iVar26 <= iVar24) {
          iVar26 = iVar24;
        }
        if (iVar18 < iVar26) {
          __dest_00 = (float *)MemAlloc((long)iVar26 << 2);
          __src = (pIVar11->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            memcpy(__dest_00,__src,(long)(pIVar11->TablesLastTimeActive).Size << 2);
            MemFree((pIVar11->TablesLastTimeActive).Data);
          }
          (pIVar11->TablesLastTimeActive).Data = __dest_00;
          (pIVar11->TablesLastTimeActive).Capacity = iVar26;
        }
      }
      iVar18 = (pIVar11->TablesLastTimeActive).Size;
      lVar20 = (long)iVar18;
      if (iVar18 <= iVar21) {
        iVar18 = (iVar21 - iVar18) + 1;
        do {
          (pIVar11->TablesLastTimeActive).Data[lVar20] = -1.0;
          lVar20 = lVar20 + 1;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      (pIVar11->TablesLastTimeActive).Size = iVar24;
    }
    (pIVar11->TablesLastTimeActive).Data[iVar21] = (float)pIVar11->Time;
    pIVar7[lVar28 + -1].LastTimeActive = (float)pIVar11->Time;
    table->MemoryCompacted = false;
    pIVar30 = (table->Columns).Data;
    iVar18 = (int)((long)(table->Columns).DataEnd - (long)pIVar30 >> 3) * -0x3b13b13b;
    if (iVar18 == columns_count || iVar18 == 0) {
      local_e8 = (void *)0x0;
      pIVar30 = (ImGuiTableColumn *)0x0;
    }
    else {
      local_e8 = table->RawData;
      table->RawData = (void *)0x0;
    }
    if (table->RawData == (void *)0x0) {
      TableBeginInitMemory(table,columns_count);
      table->IsSettingsRequestLoad = true;
      table->IsInitializing = true;
    }
    if (table->IsResetAllRequest == true) {
      table->IsInitializing = true;
      table->IsResetAllRequest = false;
      table->IsSettingsRequestLoad = false;
      table->IsSettingsDirty = true;
      table->SettingsLoadedFlags = 0;
    }
    if (table->IsInitializing == true) {
      table->SettingsOffset = -1;
      table->IsSortSpecsDirty = true;
      table->InstanceInteracted = -1;
      table->ContextPopupColumn = -1;
      table->ReorderColumn = -1;
      table->HoveredColumnBody = -1;
      table->HoveredColumnBorder = -1;
      table->AutoFitSingleColumn = -1;
      table->ResizedColumn = -1;
      table->LastResizedColumn = -1;
      if (0 < columns_count) {
        lVar28 = 0x66;
        uVar27 = 0;
        do {
          pIVar10 = (table->Columns).Data;
          puVar2 = (undefined1 *)((long)&pIVar10->Flags + lVar28);
          if ((pIVar30 == (ImGuiTableColumn *)0x0) || ((long)iVar18 <= (long)uVar27)) {
            uVar4 = *(undefined4 *)((long)pIVar10 + lVar28 + -0x52);
            local_98._Current = 0;
            local_98._Count = 0;
            local_98._Channels._0_7_ = 0;
            local_a8.x = 0.0;
            local_a8.y = 0.0;
            uStack_a0 = 0;
            local_98._Channels._7_4_ = 0xffffff00;
            local_98._Channels.Data._3_4_ = 0xffffffff;
            *(undefined8 *)(puVar2 + -0x66) = 0;
            *(undefined8 *)(puVar2 + -0x5e) = 0;
            *(undefined8 *)((long)pIVar10 + lVar28 + -0x56) = 0xbf800000;
            *(undefined4 *)((long)pIVar10 + lVar28 + -0x4e) = 0xbf800000;
            puVar23 = (undefined8 *)((long)pIVar10 + lVar28 + -0x4a);
            *puVar23 = 0;
            puVar23[1] = 0;
            *(undefined4 *)((long)pIVar10 + lVar28 + -0x3a) = 0;
            puVar23 = (undefined8 *)((long)pIVar10 + lVar28 + -0x36);
            *puVar23 = 0;
            puVar23[1] = 0;
            puVar23 = (undefined8 *)((long)pIVar10 + lVar28 + -0x26);
            *puVar23 = 0;
            puVar23[1] = 0;
            *(undefined8 *)((long)pIVar10 + lVar28 + -0x17) = 0xffffffffffffff00;
            *(undefined8 *)((long)pIVar10 + lVar28 + -0xc) = 0;
            *(undefined4 *)((long)pIVar10 + lVar28 + -5) = 0;
            *(undefined2 *)((long)pIVar10 + lVar28 + -1) = 0;
            *(undefined4 *)((long)pIVar10 + lVar28 + -0x52) = uVar4;
            *(undefined1 *)((long)pIVar10 + lVar28 + -5) = 1;
            *(undefined2 *)((long)pIVar10 + lVar28 + -0xb) = 0x101;
            *(undefined4 *)((long)pIVar10 + lVar28 + -0xf) = 0x1ffffff;
          }
          else {
            puVar3 = (undefined1 *)((long)&pIVar30->Flags + lVar28);
            puVar22 = (undefined4 *)(puVar3 + -0x66);
            puVar23 = (undefined8 *)(puVar2 + -0x66);
            for (lVar20 = 0x19; lVar20 != 0; lVar20 = lVar20 + -1) {
              *(undefined4 *)puVar23 = *puVar22;
              puVar22 = puVar22 + (ulong)bVar31 * -2 + 1;
              puVar23 = (undefined8 *)((long)puVar23 + (ulong)bVar31 * -8 + 4);
            }
            *puVar2 = *puVar3;
            *(undefined2 *)(puVar2 + -2) = *(undefined2 *)(puVar3 + -2);
          }
          (table->DisplayOrderToIndex).Data[uVar27] = (char)uVar27;
          *(char *)((long)pIVar10 + lVar28 + -0x14) = (char)uVar27;
          uVar27 = uVar27 + 1;
          lVar28 = lVar28 + 0x68;
        } while ((uint)columns_count != uVar27);
      }
    }
    if (local_e8 != (void *)0x0) {
      MemFree(local_e8);
    }
    if (table->IsSettingsRequestLoad == true) {
      TableLoadSettings(table);
    }
    fVar38 = pIVar11->FontSize;
    fVar34 = table->RefScale;
    if ((fVar34 != 0.0) || (NAN(fVar34))) {
      if (((fVar34 != fVar38) || (NAN(fVar34) || NAN(fVar38))) && (0 < columns_count)) {
        lVar28 = 0;
        do {
          pIVar30 = (table->Columns).Data;
          *(float *)((long)&pIVar30->WidthRequest + lVar28) =
               *(float *)((long)&pIVar30->WidthRequest + lVar28) * (fVar38 / fVar34);
          lVar28 = lVar28 + 0x68;
        } while ((ulong)(uint)columns_count * 0x68 - lVar28 != 0);
      }
    }
    table->RefScale = fVar38;
    pIVar9->SkipItems = true;
    if (0 < (table->ColumnsNames).Buf.Size) {
      iVar18 = (table->ColumnsNames).Buf.Capacity;
      if (iVar18 < 0) {
        uVar19 = iVar18 / 2 + iVar18;
        size = 0;
        if (0 < (int)uVar19) {
          size = (size_t)uVar19;
        }
        __dest_01 = (char *)MemAlloc(size);
        __src_00 = (table->ColumnsNames).Buf.Data;
        if (__src_00 != (char *)0x0) {
          memcpy(__dest_01,__src_00,(long)(table->ColumnsNames).Buf.Size);
          MemFree((table->ColumnsNames).Buf.Data);
        }
        (table->ColumnsNames).Buf.Data = __dest_01;
        (table->ColumnsNames).Buf.Capacity = (int)size;
      }
      (table->ColumnsNames).Buf.Size = 0;
    }
    TableBeginApplyRequests(table);
    bVar12 = true;
  }
  else {
LAB_00231c06:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;
    if (instance_no > 0 && table->InstanceDataExtra.Size < instance_no)
        table->InstanceDataExtra.push_back(ImGuiTableInstanceData());

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_PRINT("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}